

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::DebugCallbackFunctionCase::iterate
          (DebugCallbackFunctionCase *this)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  ScopedLogSection local_110;
  ScopedLogSection section_1;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  string local_a8;
  undefined1 local_88 [8];
  ResultCollector result;
  CallLogWrapper gl;
  DebugCallbackFunctionCase *this_local;
  
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    bVar1 = isKHRDebugSupported((this->super_TestCase).m_context);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
                 (Functions *)CONCAT44(extraout_var,iVar3),pTVar5);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8," // ERROR: ",(allocator<char> *)((long)&section.m_log + 7));
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_88,pTVar5,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
      glu::CallLogWrapper::enableLogging
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Initial",&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar5,&local_d8,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      deqp::gls::StateQueryUtil::verifyStatePointer
                ((ResultCollector *)local_88,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,0x8244,(void *)0x0,QUERY_POINTER);
      tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Set",&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Set",&local_159);
      tcu::ScopedLogSection::ScopedLogSection(&local_110,pTVar5,&local_130,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      glu::CallLogWrapper::glDebugMessageCallback
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dummyCallback,(void *)0x0);
      deqp::gls::StateQueryUtil::verifyStatePointer
                ((ResultCollector *)local_88,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,0x8244,dummyCallback,QUERY_POINTER);
      tcu::ScopedLogSection::~ScopedLogSection(&local_110);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_88,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_88);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0xb08);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

DebugCallbackFunctionCase::IterateResult DebugCallbackFunctionCase::iterate (void)
{
	using namespace gls::StateQueryUtil;
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Initial", "Initial");

		verifyStatePointer(result, gl, GL_DEBUG_CALLBACK_FUNCTION, 0, QUERY_POINTER);
	}

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Set", "Set");

		gl.glDebugMessageCallback(dummyCallback, DE_NULL);
		verifyStatePointer(result, gl, GL_DEBUG_CALLBACK_FUNCTION, (const void*)dummyCallback, QUERY_POINTER);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}